

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCtrlSystem.cpp
# Opt level: O1

void __thiscall CCtrlSystem::CCtrlSystem(CCtrlSystem *this)

{
  char cVar1;
  int iVar2;
  CWorker **ppCVar3;
  CCtrlSystem *this_00;
  ulong uVar4;
  char ch;
  ifstream ifs;
  char local_219;
  CCtrlSystem local_218 [2];
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(local_218);
  std::ifstream::open((char *)local_218,0x1060ec);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"File is not exist! ",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    this->_isFileEmpty = 1;
    this->_size = 0;
    this->_p_workerArray = (CWorker **)0x0;
    std::ifstream::close();
  }
  else {
    this_00 = local_218;
    std::operator>>((istream *)this_00,&local_219);
    if ((abStack_1f8[*(long *)(local_218[0]._0_8_ + -0x18)] & 2) == 0) {
      iVar2 = getSize(this_00,(ifstream *)local_218);
      this->_isFileEmpty = 0;
      this->_size = iVar2;
      uVar4 = 0xffffffffffffffff;
      if (-1 < iVar2) {
        uVar4 = (long)iVar2 * 8;
      }
      ppCVar3 = (CWorker **)operator_new__(uVar4);
      this->_p_workerArray = ppCVar3;
      initArray(this);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"File exist but is empty! ",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      this->_isFileEmpty = 1;
      this->_size = 0;
      this->_p_workerArray = (CWorker **)0x0;
      std::ifstream::close();
    }
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

CCtrlSystem::CCtrlSystem(/* args */)
{
	ifstream ifs;
	ifs.open(FILENAME, ios::in);
	if (!ifs.is_open())
	{
		cout << "File is not exist! " << endl;
		this->_isFileEmpty = true;
		this->_size = 0;
		this->_p_workerArray = nullptr;
		ifs.close();
		return;

		
	}
	char ch;
	ifs >> ch;
	if (ifs.eof())
	{
		cout << "File exist but is empty! " << endl;
		this->_isFileEmpty = true;
		this->_size = 0;
		this->_p_workerArray = nullptr;
		ifs.close();
		return;
	}
	else
	{
		int size = this->getSize(ifs);
		// cout << "Workers' number is: " << size << endl;
		this->_isFileEmpty = false;
		this->_size = size;
		this->_p_workerArray = new CWorker *[this->_size];
		this->initArray();
	}
}